

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::Curve::Create(vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                    *__return_storage_ptr__,Transform *renderFromObject,Transform *objectFromRender,
                   bool reverseOrientation,ParameterDictionary *parameters,FileLoc *loc,
                   Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  span<const_pbrt::Normal3<float>_> norm;
  pointer pPVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int splitDepth;
  memory_resource *pmVar7;
  ulong uVar8;
  long lVar9;
  pointer pNVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  Float FVar16;
  float fVar17;
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  span<const_pbrt::Point3<float>_> cp_02;
  span<const_pbrt::Point3<float>_> cp_03;
  span<const_pbrt::Point3<float>_> c_00;
  int degree;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *local_188;
  Float local_17c;
  array<pbrt::Point3<float>,_4> segCpBezier;
  CurveType local_13c;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> c;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> cp;
  int local_dc;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  string curveType;
  string basis;
  array<pbrt::Point3<float>,_3> bezCp;
  
  local_188 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&segCpBezier,"width",(allocator<char> *)&c);
  local_17c = ParameterDictionary::GetOneFloat(parameters,(string *)&segCpBezier,1.0);
  std::__cxx11::string::~string((string *)&segCpBezier);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&segCpBezier,"width0",(allocator<char> *)&c);
  FVar16 = ParameterDictionary::GetOneFloat(parameters,(string *)&segCpBezier,local_17c);
  std::__cxx11::string::~string((string *)&segCpBezier);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&segCpBezier,"width1",(allocator<char> *)&c);
  local_17c = ParameterDictionary::GetOneFloat(parameters,(string *)&segCpBezier,local_17c);
  std::__cxx11::string::~string((string *)&segCpBezier);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&segCpBezier,"degree",(allocator<char> *)&c);
  iVar6 = ParameterDictionary::GetOneInt(parameters,(string *)&segCpBezier,3);
  std::__cxx11::string::~string((string *)&segCpBezier);
  degree = iVar6;
  if (iVar6 - 4U < 0xfffffffe) {
    Error<int&>(loc,"Invalid degree %d: only degree 2 and 3 curves are supported.",&degree);
    pmVar7 = pstd::pmr::new_delete_resource();
    (local_188->alloc).memoryResource = pmVar7;
    local_188->nStored = 0;
    local_188->ptr = (ShapeHandle *)0x0;
    local_188->nAlloc = 0;
    return local_188;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&segCpBezier,"basis",(allocator<char> *)&bezCp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c,"bezier",(allocator<char> *)&curveType);
  ParameterDictionary::GetOneString(&basis,parameters,(string *)&segCpBezier,(string *)&c);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&segCpBezier);
  bVar4 = std::operator!=(&basis,"bezier");
  if ((bVar4) && (bVar4 = std::operator!=(&basis,"bspline"), bVar4)) {
    Error<std::__cxx11::string&>
              (loc,"Invalid basis \"%s\": only \"bezier\" and \"bspline\" are supported.",&basis);
    pmVar7 = pstd::pmr::new_delete_resource();
    (local_188->alloc).memoryResource = pmVar7;
    local_188->nStored = 0;
    local_188->ptr = (ShapeHandle *)0x0;
    local_188->nAlloc = 0;
    goto LAB_003ec866;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&segCpBezier,"P",(allocator<char> *)&c);
  ParameterDictionary::GetPoint3fArray(&cp,parameters,(string *)&segCpBezier);
  std::__cxx11::string::~string((string *)&segCpBezier);
  bVar4 = std::operator==(&basis,"bezier");
  uVar8 = ((long)cp.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)cp.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0xc;
  uVar13 = (ulong)degree;
  fVar17 = (float)uVar8;
  if (bVar4) {
    if ((~uVar13 + uVar8) % uVar13 == 0) {
      iVar6 = (int)((uVar8 - 1) / uVar13);
      goto LAB_003ec2e8;
    }
    c.alloc.memoryResource._0_4_ = (float)(degree + 1);
    segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.x = fVar17;
    Error<int,int&,int,int&>
              (loc,
               "Invalid number of control points %d: for the degree %d Bezier basis %d + n * %d are required, for n >= 0."
               ,(int *)&segCpBezier,&degree,(int *)&c,&degree);
LAB_003ec2b6:
    pmVar7 = pstd::pmr::new_delete_resource();
    (local_188->alloc).memoryResource = pmVar7;
    local_188->ptr = (ShapeHandle *)0x0;
    local_188->nAlloc = 0;
    local_188->nStored = 0;
  }
  else {
    if (uVar8 < (ulong)(long)(degree + 1)) {
      segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.x = fVar17;
      c.alloc.memoryResource._0_4_ = (float)(degree + 1);
      Error<int,int&,int>(loc,
                          "Invalid number of control points %d: for the degree %d b-spline basis, must have >= %d."
                          ,(int *)&segCpBezier,&degree,(int *)&c);
      goto LAB_003ec2b6;
    }
    iVar6 = (int)fVar17 - degree;
LAB_003ec2e8:
    local_dc = iVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&segCpBezier,"type",(allocator<char> *)&bezCp);
    std::__cxx11::string::string<std::allocator<char>>((string *)&c,"flat",(allocator<char> *)&n);
    ParameterDictionary::GetOneString(&curveType,parameters,(string *)&segCpBezier,(string *)&c);
    std::__cxx11::string::~string((string *)&c);
    std::__cxx11::string::~string((string *)&segCpBezier);
    bVar5 = std::operator==(&curveType,"flat");
    bVar4 = false;
    local_13c = Flat;
    if (!bVar5) {
      bVar4 = std::operator==(&curveType,"ribbon");
      if (bVar4) {
        local_13c = Ribbon;
        bVar4 = true;
      }
      else {
        local_13c = Cylinder;
        bVar4 = std::operator==(&curveType,"cylinder");
        if (!bVar4) {
          Error<std::__cxx11::string&>
                    (loc,"Unknown curve type \"%s\".  Using \"cylinder\".",&curveType);
        }
        bVar4 = false;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&segCpBezier,"N",(allocator<char> *)&c);
    ParameterDictionary::GetNormal3fArray(&n,parameters,(string *)&segCpBezier);
    std::__cxx11::string::~string((string *)&segCpBezier);
    if (n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_start ==
        n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (!bVar4) goto LAB_003ec4a3;
      Error(loc,"Must provide normals \"N\" at curve endpoints with ribbon curves.");
LAB_003ec824:
      pmVar7 = pstd::pmr::new_delete_resource();
      (local_188->alloc).memoryResource = pmVar7;
      local_188->nStored = 0;
      local_188->ptr = (ShapeHandle *)0x0;
      local_188->nAlloc = 0;
    }
    else {
      if (bVar4) {
        lVar9 = ((long)n.
                       super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)n.
                      super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc;
        if (lVar9 != iVar6 + 1) {
          segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.x = (float)lVar9;
          c.alloc.memoryResource._0_4_ = (float)(iVar6 + 1);
          Error<int,int,int&>(loc,
                              "Invalid number of normals %d: must provide %d normals for ribbon curves with %d segments."
                              ,(int *)&segCpBezier,(int *)&c,&local_dc);
          goto LAB_003ec824;
        }
      }
      else {
        Warning<>("Curve normals are only used with \"ribbon\" type curves.");
        std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::operator=
                  (&n,(initializer_list<pbrt::Normal3<float>_>)ZEXT816(0));
      }
LAB_003ec4a3:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&segCpBezier,"splitdepth",(allocator<char> *)&c);
      splitDepth = ParameterDictionary::GetOneInt(parameters,(string *)&segCpBezier,3);
      std::__cxx11::string::~string((string *)&segCpBezier);
      if ((bVar4) &&
         (n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl
          .super__Vector_impl_data._M_start ==
          n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish)) {
        Error(loc,"Must provide normals \"N\" at curve endpoints with ribbon curves.");
        goto LAB_003ec824;
      }
      lVar9 = 0;
      (local_188->alloc).memoryResource = alloc.memoryResource;
      local_188->nStored = 0;
      local_188->ptr = (ShapeHandle *)0x0;
      local_188->nAlloc = 0;
      iVar15 = 0;
      while (lVar9 < iVar6) {
        pstd::array<pbrt::Point3<float>,_4>::array(&segCpBezier);
        bVar4 = std::operator==(&basis,"bezier");
        pPVar3 = cp.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar11 = (long)iVar15;
        if (bVar4) {
          if (degree == 2) {
            uVar8 = ((long)cp.
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)cp.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc - lVar11;
            if (2 < uVar8) {
              uVar8 = 3;
            }
            cp_00.ptr = cp.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar11;
            cp_00.n = uVar8;
            ElevateQuadraticBezierToCubic((array<pbrt::Point3<float>,_4> *)&c,cp_00);
            segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.y = c.alloc.memoryResource._4_4_
            ;
            segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.x = c.alloc.memoryResource._0_4_
            ;
            segCpBezier.values._8_8_ = c.ptr;
            segCpBezier.values[1].super_Tuple3<pbrt::Point3,_float>.y = (float)(undefined4)c.nAlloc;
            segCpBezier.values[1].super_Tuple3<pbrt::Point3,_float>.z = (float)c.nAlloc._4_4_;
            segCpBezier.values[2].super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)c.nStored
            ;
            segCpBezier.values[2].super_Tuple3<pbrt::Point3,_float>.y = (float)c.nStored._4_4_;
            iVar14 = degree;
          }
          else {
            for (lVar12 = 0; iVar14 = degree, lVar12 != 0x30; lVar12 = lVar12 + 0xc) {
              *(undefined4 *)
               ((long)&segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.z + lVar12) =
                   *(undefined4 *)
                    ((long)&pPVar3[lVar11].super_Tuple3<pbrt::Point3,_float>.z + lVar12);
              *(undefined8 *)
               ((long)&segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar12) =
                   *(undefined8 *)
                    ((long)&pPVar3[lVar11].super_Tuple3<pbrt::Point3,_float>.x + lVar12);
            }
          }
        }
        else if (degree == 2) {
          uVar8 = ((long)cp.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)cp.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc - lVar11;
          if (2 < uVar8) {
            uVar8 = 3;
          }
          cp_01.ptr = cp.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar11;
          cp_01.n = uVar8;
          QuadraticBSplineToBezier(&bezCp,cp_01);
          cp_02.n = 3;
          cp_02.ptr = bezCp.values;
          ElevateQuadraticBezierToCubic((array<pbrt::Point3<float>,_4> *)&c,cp_02);
          segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.y = c.alloc.memoryResource._4_4_;
          segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.x = c.alloc.memoryResource._0_4_;
          segCpBezier.values._8_8_ = c.ptr;
          segCpBezier.values[1].super_Tuple3<pbrt::Point3,_float>.y = (float)(undefined4)c.nAlloc;
          segCpBezier.values[1].super_Tuple3<pbrt::Point3,_float>.z = (float)c.nAlloc._4_4_;
          segCpBezier.values[2].super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)c.nStored;
          segCpBezier.values[2].super_Tuple3<pbrt::Point3,_float>.y = (float)c.nStored._4_4_;
          iVar14 = 1;
        }
        else {
          uVar8 = ((long)cp.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)cp.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc - lVar11;
          if (3 < uVar8) {
            uVar8 = 4;
          }
          cp_03.ptr = cp.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar11;
          cp_03.n = uVar8;
          CubicBSplineToBezier((array<pbrt::Point3<float>,_4> *)&c,cp_03);
          segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.y = c.alloc.memoryResource._4_4_;
          segCpBezier.values[0].super_Tuple3<pbrt::Point3,_float>.x = c.alloc.memoryResource._0_4_;
          segCpBezier.values._8_8_ = c.ptr;
          segCpBezier.values[1].super_Tuple3<pbrt::Point3,_float>.y = (float)(undefined4)c.nAlloc;
          segCpBezier.values[1].super_Tuple3<pbrt::Point3,_float>.z = (float)c.nAlloc._4_4_;
          segCpBezier.values[2].super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)c.nStored;
          segCpBezier.values[2].super_Tuple3<pbrt::Point3,_float>.y = (float)c.nStored._4_4_;
          iVar14 = 1;
        }
        fVar17 = (float)(int)lVar9 / (float)iVar6;
        pNVar10 = (pointer)0x0;
        if (n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pNVar10 = n.
                    super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar9;
        }
        lVar9 = lVar9 + 1;
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)(local_17c * fVar17)),ZEXT416((uint)FVar16),
                                 ZEXT416((uint)(1.0 - fVar17)));
        fVar17 = (float)(int)lVar9 / (float)iVar6;
        auVar2 = vfmadd231ss_fma(ZEXT416((uint)(local_17c * fVar17)),ZEXT416((uint)FVar16),
                                 ZEXT416((uint)(1.0 - fVar17)));
        norm.n._0_4_ = (uint)(n.
                              super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start !=
                             n.
                             super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish) * 2;
        norm.ptr = pNVar10;
        norm.n._4_4_ = 0;
        c_00.n = 4;
        c_00.ptr = segCpBezier.values;
        CreateCurve(&c,renderFromObject,objectFromRender,reverseOrientation,c_00,auVar1._0_4_,
                    auVar2._0_4_,local_13c,norm,splitDepth,alloc);
        pstd::vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>>::
        insert<pbrt::ShapeHandle*>
                  ((vector<pbrt::ShapeHandle,pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>> *)
                   local_188,local_188->ptr + local_188->nStored,c.ptr,c.ptr + c.nStored);
        iVar15 = iVar15 + iVar14;
        pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
        ~vector(&c);
      }
    }
    std::_Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~_Vector_base
              (&n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>);
    std::__cxx11::string::~string((string *)&curveType);
  }
  std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
            (&cp.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
LAB_003ec866:
  std::__cxx11::string::~string((string *)&basis);
  return local_188;
}

Assistant:

pstd::vector<ShapeHandle> Curve::Create(const Transform *renderFromObject,
                                        const Transform *objectFromRender,
                                        bool reverseOrientation,
                                        const ParameterDictionary &parameters,
                                        const FileLoc *loc, Allocator alloc) {
    Float width = parameters.GetOneFloat("width", 1.f);
    Float width0 = parameters.GetOneFloat("width0", width);
    Float width1 = parameters.GetOneFloat("width1", width);

    int degree = parameters.GetOneInt("degree", 3);
    if (degree != 2 && degree != 3) {
        Error(loc, "Invalid degree %d: only degree 2 and 3 curves are supported.",
              degree);
        return {};
    }

    std::string basis = parameters.GetOneString("basis", "bezier");
    if (basis != "bezier" && basis != "bspline") {
        Error(loc,
              "Invalid basis \"%s\": only \"bezier\" and \"bspline\" are "
              "supported.",
              basis);
        return {};
    }

    int nSegments;
    std::vector<Point3f> cp = parameters.GetPoint3fArray("P");
    if (basis == "bezier") {
        // After the first segment, which uses degree+1 control points,
        // subsequent segments reuse the last control point of the previous
        // one and then use degree more control points.
        if (((cp.size() - 1 - degree) % degree) != 0) {
            Error(loc,
                  "Invalid number of control points %d: for the degree %d "
                  "Bezier basis %d + n * %d are required, for n >= 0.",
                  (int)cp.size(), degree, degree + 1, degree);
            return {};
        }
        nSegments = (cp.size() - 1) / degree;
    } else {
        if (cp.size() < degree + 1) {
            Error(loc,
                  "Invalid number of control points %d: for the degree %d "
                  "b-spline basis, must have >= %d.",
                  int(cp.size()), degree, degree + 1);
            return {};
        }
        nSegments = cp.size() - degree;
    }

    CurveType type;
    std::string curveType = parameters.GetOneString("type", "flat");
    if (curveType == "flat")
        type = CurveType::Flat;
    else if (curveType == "ribbon")
        type = CurveType::Ribbon;
    else if (curveType == "cylinder")
        type = CurveType::Cylinder;
    else {
        Error(loc, R"(Unknown curve type "%s".  Using "cylinder".)", curveType);
        type = CurveType::Cylinder;
    }

    std::vector<Normal3f> n = parameters.GetNormal3fArray("N");
    if (!n.empty()) {
        if (type != CurveType::Ribbon) {
            Warning("Curve normals are only used with \"ribbon\" type curves.");
            n = {};
        } else if (n.size() != nSegments + 1) {
            Error(loc,
                  "Invalid number of normals %d: must provide %d normals for "
                  "ribbon "
                  "curves with %d segments.",
                  int(n.size()), nSegments + 1, nSegments);
            return {};
        }
    } else if (type == CurveType::Ribbon) {
        Error(loc, "Must provide normals \"N\" at curve endpoints with ribbon "
                   "curves.");
        return {};
    }

    int sd = parameters.GetOneInt("splitdepth", 3);

    if (type == CurveType::Ribbon && n.empty()) {
        Error(loc, "Must provide normals \"N\" at curve endpoints with ribbon "
                   "curves.");
        return {};
    }

    pstd::vector<ShapeHandle> curves(alloc);
    // Pointer to the first control point for the current segment. This is
    // updated after each loop iteration depending on the current basis.
    int cpOffset = 0;
    for (int seg = 0; seg < nSegments; ++seg) {
        pstd::array<Point3f, 4> segCpBezier;

        // First, compute the cubic Bezier control points for the current
        // segment and store them in segCpBezier. (It is admittedly
        // wasteful storage-wise to turn b-splines into Bezier segments and
        // wasteful computationally to turn quadratic curves into cubics,
        // but yolo.)
        if (basis == "bezier") {
            if (degree == 2) {
                // Elevate to degree 3.
                segCpBezier = ElevateQuadraticBezierToCubic(
                    pstd::MakeConstSpan(cp).subspan(cpOffset, 3));
            } else {
                // All set.
                for (int i = 0; i < 4; ++i)
                    segCpBezier[i] = cp[cpOffset + i];
            }
            cpOffset += degree;
        } else {
            // Uniform b-spline.
            if (degree == 2) {
                pstd::array<Point3f, 3> bezCp = QuadraticBSplineToBezier(
                    pstd::MakeConstSpan(cp).subspan(cpOffset, 3));
                segCpBezier = ElevateQuadraticBezierToCubic(pstd::MakeConstSpan(bezCp));
            } else {
                segCpBezier =
                    CubicBSplineToBezier(pstd::MakeConstSpan(cp).subspan(cpOffset, 4));
            }
            ++cpOffset;
        }

        pstd::span<const Normal3f> nspan;
        if (!n.empty())
            nspan = pstd::MakeSpan(&n[seg], 2);
        auto c =
            CreateCurve(renderFromObject, objectFromRender, reverseOrientation,
                        segCpBezier, Lerp(Float(seg) / Float(nSegments), width0, width1),
                        Lerp(Float(seg + 1) / Float(nSegments), width0, width1), type,
                        nspan, sd, alloc);
        curves.insert(curves.end(), c.begin(), c.end());
    }
    return curves;
}